

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall r_comp::Preprocessor::initialize(Preprocessor *this,Metadata *metadata)

{
  size_t *this_00;
  uint16_t uVar1;
  undefined *puVar2;
  char *pcVar3;
  short sVar4;
  bool bVar5;
  ReturnType RVar6;
  mapped_type *pmVar7;
  element_type *peVar8;
  reference psVar9;
  reference pvVar10;
  mapped_type *this_01;
  long lVar11;
  __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  Class *pCVar12;
  Class *pCVar13;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_758;
  string local_740 [36];
  Atom local_71c [4];
  Class local_718;
  string local_6d0 [32];
  string local_6b0 [8];
  string function_name;
  allocator local_679;
  string local_678 [39];
  allocator local_651;
  string local_650 [32];
  StructureMember local_630;
  undefined1 local_5d0 [8];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> r_set;
  string local_5a0 [36];
  Atom local_57c [4];
  Class local_578;
  string local_530 [32];
  string local_510 [8];
  string operator_name;
  shared_ptr<r_comp::RepliStruct> local_4f0;
  ReturnType local_4dc;
  undefined1 local_4d8 [4];
  ReturnType return_type;
  undefined1 local_4c8 [8];
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  tpl_args_1;
  string local_498 [36];
  Atom local_474 [4];
  Class local_470;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_428;
  string local_410 [36];
  undefined4 local_3ec;
  Class local_3e8;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_3a0;
  string local_388 [36];
  undefined4 local_364;
  Class local_360;
  string local_318 [8];
  string base_class;
  Atom local_2f8 [4];
  Atom local_2f4 [4];
  Atom local_2f0 [4];
  Atom local_2ec [4];
  Atom local_2e8 [4];
  Atom local_2e4 [4];
  Atom local_2e0 [4];
  undefined4 local_2dc;
  undefined1 local_2d8 [4];
  Atom atom;
  undefined1 local_2c8 [8];
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  tpl_args;
  string local_2a0 [36];
  int local_27c;
  long lStack_278;
  ClassType class_type;
  size_t p;
  string class_name;
  allocator local_249;
  string local_248 [8];
  string sset;
  undefined1 local_228 [8];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> members;
  Ptr s;
  undefined1 local_1f8 [8];
  Ptr replistruct;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *__range1;
  string local_1c8 [32];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_1a8;
  allocator local_189;
  string local_188 [36];
  Atom local_164 [4];
  Class local_160;
  undefined1 local_118 [8];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> r_type;
  string local_f8 [32];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_d8;
  allocator local_b9;
  string local_b8 [52];
  Atom local_84 [4];
  Class local_80;
  undefined1 local_38 [8];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> r_xpr;
  uint16_t operator_opcode;
  uint16_t function_opcode;
  Metadata *metadata_local;
  Preprocessor *this_local;
  
  this->m_metadata = metadata;
  this->m_classOpcode = 0;
  r_xpr.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0;
  r_xpr.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)local_38);
  r_code::Atom::Object((ushort)local_84,(uchar)this->m_classOpcode);
  puVar2 = Class::Expression;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,puVar2,&local_b9);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&local_d8,
             (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)local_38);
  Class::Class(&local_80,local_84,(string *)local_b8,&local_d8,ANY);
  puVar2 = Class::Expression;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f8,puVar2,
             (allocator *)
             ((long)&r_type.
                     super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
           ::operator[](&metadata->classes,(key_type *)local_f8);
  Class::operator=(pmVar7,&local_80);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&r_type.
                     super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Class::~Class(&local_80);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector(&local_d8)
  ;
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  r_code::Atom::~Atom(local_84);
  this->m_classOpcode = this->m_classOpcode + 1;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)local_118)
  ;
  r_code::Atom::Object((ushort)local_164,(uchar)this->m_classOpcode);
  pcVar3 = Class::Type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,pcVar3,&local_189);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&local_1a8,
             (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)local_118)
  ;
  Class::Class(&local_160,local_164,(string *)local_188,&local_1a8,ANY);
  pcVar3 = Class::Type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,pcVar3,(allocator *)((long)&__range1 + 7));
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
           ::operator[](&metadata->classes,(key_type *)local_1c8);
  Class::operator=(pmVar7,&local_160);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  Class::~Class(&local_160);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_1a8);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  r_code::Atom::~Atom(local_164);
  this->m_classOpcode = this->m_classOpcode + 1;
  peVar8 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1 = std::
           vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ::begin(&peVar8->args);
  replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
         ::end(&peVar8->args);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                                     *)&replistruct.
                                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar5) {
    psVar9 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)local_1f8,psVar9);
    peVar8 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1f8);
    if (peVar8->type == Directive) {
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1f8);
      pvVar10 = std::
                vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                ::front(&peVar8->args);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)
                 &members.
                  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar10);
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                 local_228);
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1f8);
      bVar5 = std::operator==(&peVar8->cmd,"!class");
      if (bVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_248,"[]",&local_249);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        peVar8 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&members.
                                  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::string((string *)&p,(string *)&peVar8->cmd);
        lStack_278 = std::__cxx11::string::find((string *)&p,(ulong)local_248);
        local_27c = 2;
        if (lStack_278 == -1) {
          local_27c = 0;
        }
        if (local_27c == 2) {
          std::__cxx11::string::length();
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_2a0,(ulong)&p);
          std::__cxx11::string::operator=((string *)&p,local_2a0);
          std::__cxx11::string::~string(local_2a0);
        }
        this_00 = &tpl_args.
                   super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                   ._M_impl._M_node._M_size;
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                  ((shared_ptr<r_comp::RepliStruct> *)this_00,
                   (shared_ptr<r_comp::RepliStruct> *)
                   &members.
                    super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar5 = isTemplateClass(this,(Ptr *)this_00);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                  ((shared_ptr<r_comp::RepliStruct> *)
                   &tpl_args.
                    super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    ._M_impl._M_node._M_size);
        if (bVar5) {
          this_01 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>_>_>
                    ::operator[](&this->m_templateClasses,(key_type *)&p);
          std::shared_ptr<r_comp::RepliStruct>::operator=
                    (this_01,(shared_ptr<r_comp::RepliStruct> *)
                             &members.
                              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          std::__cxx11::
          list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::list((list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                  *)local_2c8);
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)local_2d8,
                     (shared_ptr<r_comp::RepliStruct> *)
                     &members.
                      super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          getMembers(this,(shared_ptr<r_comp::RepliStruct> *)local_2d8,
                     (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                     local_228,
                     (list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                      *)local_2c8,false);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)local_2d8);
          r_code::Atom::Atom((Atom *)&local_2dc,0xffffffff);
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p,"grp");
          if (bVar5) {
            uVar1 = this->m_classOpcode;
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::size
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_228);
            r_code::Atom::Group((ushort)local_2e0,(uchar)uVar1);
            r_code::Atom::operator=((Atom *)&local_2dc,local_2e0);
            r_code::Atom::~Atom(local_2e0);
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&p,"ipgm");
            if (bVar5) {
              uVar1 = this->m_classOpcode;
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::size
                        ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          *)local_228);
              r_code::Atom::InstantiatedProgram((ushort)local_2e4,(uchar)uVar1);
              r_code::Atom::operator=((Atom *)&local_2dc,local_2e4);
              r_code::Atom::~Atom(local_2e4);
            }
            else {
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&p,"icpp_pgm");
              if (bVar5) {
                uVar1 = this->m_classOpcode;
                std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::size
                          ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                            *)local_228);
                r_code::Atom::InstantiatedCPPProgram((ushort)local_2e8,(uchar)uVar1);
                r_code::Atom::operator=((Atom *)&local_2dc,local_2e8);
                r_code::Atom::~Atom(local_2e8);
              }
              else {
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&p,"cst");
                if (bVar5) {
                  uVar1 = this->m_classOpcode;
                  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
                  size((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_228);
                  r_code::Atom::CompositeState((ushort)local_2ec,(uchar)uVar1);
                  r_code::Atom::operator=((Atom *)&local_2dc,local_2ec);
                  r_code::Atom::~Atom(local_2ec);
                }
                else {
                  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&p,"mdl");
                  if (bVar5) {
                    uVar1 = this->m_classOpcode;
                    std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
                    size((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          *)local_228);
                    r_code::Atom::Model((ushort)local_2f0,(uchar)uVar1);
                    r_code::Atom::operator=((Atom *)&local_2dc,local_2f0);
                    r_code::Atom::~Atom(local_2f0);
                  }
                  else {
                    lVar11 = std::__cxx11::string::find((char *)&p,0x1ca8d9);
                    if (lVar11 == -1) {
                      uVar1 = this->m_classOpcode;
                      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                      ::size((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                              *)local_228);
                      r_code::Atom::Object((ushort)local_2f8,(uchar)uVar1);
                      r_code::Atom::operator=((Atom *)&local_2dc,local_2f8);
                      r_code::Atom::~Atom(local_2f8);
                    }
                    else {
                      uVar1 = this->m_classOpcode;
                      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                      ::size((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                              *)local_228);
                      r_code::Atom::Marker((ushort)local_2f4,(uchar)uVar1);
                      r_code::Atom::operator=((Atom *)&local_2dc,local_2f4);
                      r_code::Atom::~Atom(local_2f4);
                    }
                  }
                }
              }
            }
          }
          if (local_27c == 0) {
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&members.
                                      super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            this_02 = (__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                         ::front(&peVar8->args);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(this_02);
            std::__cxx11::string::string(local_318,(string *)&peVar8->cmd);
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_318,"_obj");
            if (((bVar5) ||
                (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_318,"_grp"), bVar5)) ||
               (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_318,"_fact"), bVar5)) {
              local_27c = 1;
            }
            std::__cxx11::string::~string(local_318);
          }
          this_03 = r_code::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator[](&metadata->class_names,(ulong)this->m_classOpcode);
          std::__cxx11::string::operator=((string *)this_03,(string *)&p);
          if (local_27c == 0) {
            local_3ec = local_2dc;
            std::__cxx11::string::string(local_410,(string *)&p);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      (&local_428,
                       (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_228);
            Class::Class(&local_3e8,(Atom *)&local_3ec,(string *)local_410,&local_428,ANY);
            pmVar7 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                     ::operator[](&metadata->classes,(key_type *)&p);
            pCVar12 = Class::operator=(pmVar7,&local_3e8);
            pCVar13 = r_code::vector<r_comp::Class>::operator[]
                                (&metadata->classes_by_opcodes,(ulong)this->m_classOpcode);
            Class::operator=(pCVar13,pCVar12);
            Class::~Class(&local_3e8);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      (&local_428);
            std::__cxx11::string::~string(local_410);
            r_code::Atom::~Atom((Atom *)&local_3ec);
          }
          else if (local_27c == 1) {
            local_364 = local_2dc;
            std::__cxx11::string::string(local_388,(string *)&p);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      (&local_3a0,
                       (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_228);
            Class::Class(&local_360,(Atom *)&local_364,(string *)local_388,&local_3a0,ANY);
            pmVar7 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                     ::operator[](&metadata->sys_classes,(key_type *)&p);
            pCVar12 = Class::operator=(pmVar7,&local_360);
            pmVar7 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                     ::operator[](&metadata->classes,(key_type *)&p);
            pCVar12 = Class::operator=(pmVar7,pCVar12);
            pCVar13 = r_code::vector<r_comp::Class>::operator[]
                                (&metadata->classes_by_opcodes,(ulong)this->m_classOpcode);
            Class::operator=(pCVar13,pCVar12);
            Class::~Class(&local_360);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      (&local_3a0);
            std::__cxx11::string::~string(local_388);
            r_code::Atom::~Atom((Atom *)&local_364);
          }
          else if (local_27c == 2) {
            uVar1 = this->m_classOpcode;
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::size
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_228);
            r_code::Atom::SSet((ushort)local_474,(uchar)uVar1);
            std::__cxx11::string::string(local_498,(string *)&p);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       &tpl_args_1.
                        super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                        ._M_impl._M_node._M_size,
                       (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_228);
            Class::Class(&local_470,local_474,(string *)local_498,
                         (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          *)&tpl_args_1.
                             super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                             ._M_impl._M_node._M_size,ANY);
            pmVar7 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                     ::operator[](&metadata->classes,(key_type *)&p);
            pCVar12 = Class::operator=(pmVar7,&local_470);
            pCVar13 = r_code::vector<r_comp::Class>::operator[]
                                (&metadata->classes_by_opcodes,(ulong)this->m_classOpcode);
            Class::operator=(pCVar13,pCVar12);
            Class::~Class(&local_470);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       &tpl_args_1.
                        super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                        ._M_impl._M_node._M_size);
            std::__cxx11::string::~string(local_498);
            r_code::Atom::~Atom(local_474);
          }
          this->m_classOpcode = this->m_classOpcode + 1;
          r_code::Atom::~Atom((Atom *)&local_2dc);
          std::__cxx11::
          list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::~list((list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                   *)local_2c8);
        }
        std::__cxx11::string::~string((string *)&p);
        std::__cxx11::string::~string(local_248);
      }
      else {
        peVar8 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1f8);
        bVar5 = std::operator==(&peVar8->cmd,"!op");
        if (bVar5) {
          std::__cxx11::
          list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::list((list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                  *)local_4c8);
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)local_4d8,
                     (shared_ptr<r_comp::RepliStruct> *)
                     &members.
                      super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          getMembers(this,(shared_ptr<r_comp::RepliStruct> *)local_4d8,
                     (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                     local_228,
                     (list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                      *)local_4c8,false);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)local_4d8);
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                    (&local_4f0,
                     (shared_ptr<r_comp::RepliStruct> *)
                     &members.
                      super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          RVar6 = getReturnType(this,&local_4f0);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_4f0);
          local_4dc = RVar6;
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&members.
                                    super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::string(local_510,(string *)&peVar8->cmd);
          std::__cxx11::string::string(local_530,local_510);
          r_code::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          push_back(&metadata->operator_names,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530);
          std::__cxx11::string::~string(local_530);
          sVar4 = r_xpr.
                  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_;
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&members.
                                    super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::size(&peVar8->args);
          r_code::Atom::Operator((ushort)local_57c,(uchar)sVar4);
          std::__cxx11::string::string(local_5a0,local_510);
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                    ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                     &r_set.
                      super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                     local_228);
          Class::Class(&local_578,local_57c,(string *)local_5a0,
                       (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       &r_set.
                        super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_4dc);
          pmVar7 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                   ::operator[](&metadata->classes,(key_type *)local_510);
          Class::operator=(pmVar7,&local_578);
          Class::~Class(&local_578);
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                    ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                     &r_set.
                      super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string(local_5a0);
          r_code::Atom::~Atom(local_57c);
          r_xpr.
          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ =
               r_xpr.
               super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ + 1;
          std::__cxx11::string::~string(local_510);
          std::__cxx11::
          list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::~list((list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                   *)local_4c8);
        }
        else {
          peVar8 = std::
                   __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_1f8);
          bVar5 = std::operator==(&peVar8->cmd,"!dfn");
          if (bVar5) {
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_5d0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_650,"",&local_651);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_678,"",&local_679);
            StructureMember::StructureMember
                      (&local_630,(_Read)Compiler::read_set,(string *)0x0,(string *)local_650,
                       (Iteration)local_678);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
            push_back((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      local_5d0,&local_630);
            StructureMember::~StructureMember(&local_630);
            std::__cxx11::string::~string(local_678);
            std::allocator<char>::~allocator((allocator<char> *)&local_679);
            std::__cxx11::string::~string(local_650);
            std::allocator<char>::~allocator((allocator<char> *)&local_651);
            peVar8 = std::
                     __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&members.
                                      super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::string(local_6b0,(string *)&peVar8->cmd);
            std::__cxx11::string::string(local_6d0,local_6b0);
            r_code::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::push_back(&metadata->function_names,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_6d0);
            std::__cxx11::string::~string(local_6d0);
            r_code::Atom::DeviceFunction((ushort)local_71c);
            std::__cxx11::string::string(local_740,local_6b0);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      (&local_758,
                       (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_5d0);
            Class::Class(&local_718,local_71c,(string *)local_740,&local_758,ANY);
            pmVar7 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                     ::operator[](&metadata->classes,(key_type *)local_6b0);
            Class::operator=(pmVar7,&local_718);
            Class::~Class(&local_718);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      (&local_758);
            std::__cxx11::string::~string(local_740);
            r_code::Atom::~Atom(local_71c);
            r_xpr.
            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ =
                 r_xpr.
                 super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ + 1;
            std::__cxx11::string::~string(local_6b0);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_5d0);
          }
        }
      }
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                 local_228);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)
                 &members.
                  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)local_1f8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)local_118)
  ;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)local_38);
  return;
}

Assistant:

void Preprocessor::initialize(Metadata *metadata)
{
    this->m_metadata = metadata;
    m_classOpcode = 0;
    uint16_t function_opcode = 0;
    uint16_t operator_opcode = 0;
    std::vector<StructureMember> r_xpr;
    metadata->classes[std::string(Class::Expression)] = Class(Atom::Object(m_classOpcode, 0), Class::Expression, r_xpr); // to read unspecified expressions in classes and sets.
    ++m_classOpcode;
    std::vector<StructureMember> r_type;
    metadata->classes[std::string(Class::Type)] = Class(Atom::Object(m_classOpcode, 0), Class::Type, r_type); // to read object types in expressions and sets.
    ++m_classOpcode;

    for (RepliStruct::Ptr replistruct : root->args) {
        if (replistruct->type != RepliStruct::Directive) {
            continue;
        }

        RepliStruct::Ptr s = replistruct->args.front();
        std::vector<StructureMember> members;

        if (replistruct->cmd == "!class") {
            std::string sset = "[]";
            std::string class_name = s->cmd;
            size_t p = class_name.find(sset);
            ClassType class_type = (p == std::string::npos ? T_CLASS : T_SET);

            if (class_type == T_SET) { // remove the trailing [] since the RepliStructs for instantiated classes do so.
                class_name = class_name.substr(0, class_name.length() - sset.length());
            }

            if (isTemplateClass(s)) {
                m_templateClasses[class_name] = s;
                continue;
            }

            std::list<RepliStruct::Ptr> tpl_args;
            getMembers(s, members, tpl_args, false);
            Atom atom;

            if (class_name == "grp") {
                atom = Atom::Group(m_classOpcode, members.size());
            } else if (class_name == "ipgm") {
                atom = Atom::InstantiatedProgram(m_classOpcode, members.size());
            } else if (class_name == "icpp_pgm") {
                atom = Atom::InstantiatedCPPProgram(m_classOpcode, members.size());
            } else if (class_name == "cst") {
                atom = Atom::CompositeState(m_classOpcode, members.size());
            } else if (class_name == "mdl") {
                atom = Atom::Model(m_classOpcode, members.size());
            } else if (class_name.find("mk.") != std::string::npos) {
                atom = Atom::Marker(m_classOpcode, members.size());
            } else {
                atom = Atom::Object(m_classOpcode, members.size());
            }

            if (class_type == T_CLASS) { // find out if the class is a sys class, i.e. is an instantiation of _obj, _grp or _fact.
                std::string base_class = s->args.front()->cmd;

                if (base_class == "_obj" || base_class == "_grp" || base_class == "_fact") {
                    class_type = T_SYS_CLASS;
                }
            }

            metadata->class_names[m_classOpcode] = class_name;

            switch (class_type) {
            case T_SYS_CLASS:
                metadata->classes_by_opcodes[m_classOpcode] = metadata->classes[class_name] = metadata->sys_classes[class_name] = Class(atom, class_name, members);
                break;

            case T_CLASS:
                metadata->classes_by_opcodes[m_classOpcode] = metadata->classes[class_name] = Class(atom, class_name, members);
                break;

            case T_SET:
                metadata->classes_by_opcodes[m_classOpcode] = metadata->classes[class_name] = Class(Atom::SSet(m_classOpcode, members.size()), class_name, members);
                break;

            default:
                break;
            }

            ++m_classOpcode;
        } else if (replistruct->cmd == "!op") {
            std::list<RepliStruct::Ptr> tpl_args;
            getMembers(s, members, tpl_args, false);
            ReturnType return_type = getReturnType(s);
            std::string operator_name = s->cmd;
            metadata->operator_names.push_back(operator_name);
            metadata->classes[operator_name] = Class(Atom::Operator(operator_opcode, s->args.size()), operator_name, members, return_type);
            ++operator_opcode;
        } else if (replistruct->cmd == "!dfn") { // don't bother to read the members, it's always a set.
            std::vector<StructureMember> r_set;
            r_set.push_back(StructureMember(&Compiler::read_set, ""));
            std::string function_name = s->cmd;
            metadata->function_names.push_back(function_name);
            metadata->classes[function_name] = Class(Atom::DeviceFunction(function_opcode), function_name, r_set);
            ++function_opcode;
        }
    }
}